

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O3

uint32 __thiscall
google::protobuf::internal::ReflectionSchema::GetFieldOffsetNonOneof
          (ReflectionSchema *this,FieldDescriptor *field)

{
  long *plVar1;
  uint uVar2;
  FieldDescriptor *local_20;
  _func_void_FieldDescriptor_ptr *local_18;
  
  if (field[0x42] == (FieldDescriptor)0x0) {
    plVar1 = (long *)(*(long *)(field + 0x50) + 0x28);
  }
  else if (*(long *)(field + 0x60) == 0) {
    plVar1 = (long *)(*(long *)(field + 0x28) + 0x80);
  }
  else {
    plVar1 = (long *)(*(long *)(field + 0x60) + 0x50);
  }
  uVar2 = this->offsets_[(int)((ulong)((long)field - *plVar1) >> 3) * 0x286bca1b];
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_18 = FieldDescriptor::TypeOnceInit;
    local_20 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),&local_18,&local_20);
  }
  if ((*(int *)(field + 0x38) == 0xc) || (*(int *)(field + 0x38) == 9)) {
    uVar2 = uVar2 & 0xfffffffe;
  }
  return uVar2;
}

Assistant:

uint32 GetFieldOffsetNonOneof(const FieldDescriptor* field) const {
    GOOGLE_DCHECK(!field->containing_oneof());
    return OffsetValue(offsets_[field->index()], field->type());
  }